

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importingCommonUnitsDefinitions_Test::~Importer_importingCommonUnitsDefinitions_Test
          (Importer_importingCommonUnitsDefinitions_Test *this)

{
  Importer_importingCommonUnitsDefinitions_Test *this_local;
  
  ~Importer_importingCommonUnitsDefinitions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, importingCommonUnitsDefinitions)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/common_units_import_1.xml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());
}